

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

int __thiscall QHttpSocketEngine::option(QHttpSocketEngine *this,SocketOption option)

{
  QHttpSocketEnginePrivate *pQVar1;
  int in_ESI;
  long in_FS_OFFSET;
  QHttpSocketEnginePrivate *d;
  int local_4c;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QHttpSocketEngine *)0x33a279);
  if (pQVar1->socket != (QTcpSocket *)0x0) {
    if (in_ESI == 7) {
      (**(code **)(*(long *)&pQVar1->socket->super_QAbstractSocket + 0x128))
                (&local_28,pQVar1->socket,0);
      local_4c = QVariant::toInt((bool *)&local_28);
      QVariant::~QVariant(&local_28);
      goto LAB_0033a320;
    }
    if (in_ESI == 8) {
      (**(code **)(*(long *)&pQVar1->socket->super_QAbstractSocket + 0x128))
                (&local_48,pQVar1->socket,1);
      local_4c = QVariant::toInt((bool *)&local_48);
      QVariant::~QVariant(&local_48);
      goto LAB_0033a320;
    }
  }
  local_4c = -1;
LAB_0033a320:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

int QHttpSocketEngine::option(SocketOption option) const
{
    Q_D(const QHttpSocketEngine);
    if (d->socket) {
        // convert the enum and call the real socket
        if (option == QAbstractSocketEngine::LowDelayOption)
            return d->socket->socketOption(QAbstractSocket::LowDelayOption).toInt();
        if (option == QAbstractSocketEngine::KeepAliveOption)
            return d->socket->socketOption(QAbstractSocket::KeepAliveOption).toInt();
    }
    return -1;
}